

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Copy_8_To_8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
                uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(undefined1 *)destinationBuffer = *sourceBuffer;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
  }
  return;
}

Assistant:

static void Copy_8_To_8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        *dest = *src;

        src += sourceStride;
        dest += destinationStride;
    }
}